

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void re2::hashword2(uint32 *k,size_t length,uint32 *pc,uint32 *pb)

{
  uint uVar1;
  int iVar2;
  uint32 *puVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  
  uVar5 = *pc + (int)length * 4 + 0xdeadbeef;
  uVar1 = *pb + uVar5;
  puVar3 = k + 2;
  uVar4 = uVar5;
  do {
    switch(length) {
    case 3:
      uVar1 = uVar1 + *puVar3;
    case 2:
      uVar4 = uVar4 + puVar3[-1];
    case 1:
      uVar1 = (uVar1 ^ uVar4) - (uVar4 << 0xe | uVar4 >> 0x12);
      uVar8 = (uVar5 + puVar3[-2] ^ uVar1) - (uVar1 * 0x800 | uVar1 >> 0x15);
      uVar6 = (uVar4 ^ uVar8) - (uVar8 * 0x2000000 | uVar8 >> 7);
      uVar1 = (uVar1 ^ uVar6) - (uVar6 * 0x10000 | uVar6 >> 0x10);
      uVar8 = (uVar8 ^ uVar1) - (uVar1 * 0x10 | uVar1 >> 0x1c);
      uVar4 = (uVar6 ^ uVar8) - (uVar8 * 0x4000 | uVar8 >> 0x12);
      uVar1 = (uVar1 ^ uVar4) - (uVar4 * 0x1000000 | uVar4 >> 8);
    case 0:
      *pc = uVar1;
      *pb = uVar4;
      return;
    default:
      uVar1 = uVar1 + *puVar3;
      uVar6 = (uVar1 * 0x10 | uVar1 >> 0x1c) ^ (uVar5 + puVar3[-2]) - uVar1;
      iVar2 = uVar1 + uVar4 + puVar3[-1];
      uVar8 = (uVar6 << 6 | uVar6 >> 0x1a) ^ (uVar4 + puVar3[-1]) - uVar6;
      iVar7 = uVar6 + iVar2;
      uVar1 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar2 - uVar8;
      iVar9 = uVar8 + iVar7;
      uVar8 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar7 - uVar1;
      iVar2 = uVar1 + iVar9;
      uVar6 = (uVar8 << 0x13 | uVar8 >> 0xd) ^ iVar9 - uVar8;
      uVar5 = uVar8 + iVar2;
      uVar1 = (uVar6 << 4 | uVar6 >> 0x1c) ^ iVar2 - uVar6;
      uVar4 = uVar6 + uVar5;
      length = length - 3;
      puVar3 = puVar3 + 3;
    }
  } while( true );
}

Assistant:

void hashword2 (
const uint32 *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32       *pc,                      /* IN: seed OUT: primary hash value */
uint32       *pb)               /* IN: more seed OUT: secondary hash value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)(length<<2)) + *pc;
  c += *pb;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc=c; *pb=b;
}